

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TACBuilderVisitor.cpp
# Opt level: O0

void __thiscall hdc::TACBuilderVisitor::visit(TACBuilderVisitor *this,MinusExpression *expression)

{
  int src1_00;
  int src2_00;
  int dst_00;
  Expression *pEVar1;
  int dst;
  int src2;
  int src1;
  MinusExpression *expression_local;
  TACBuilderVisitor *this_local;
  
  pEVar1 = BinaryOperator::getLeft(&expression->super_BinaryOperator);
  (**(pEVar1->super_Statement).super_ASTNode._vptr_ASTNode)(pEVar1,this);
  src1_00 = this->lastTemporary;
  pEVar1 = BinaryOperator::getRight(&expression->super_BinaryOperator);
  (**(pEVar1->super_Statement).super_ASTNode._vptr_ASTNode)(pEVar1,this);
  src2_00 = this->lastTemporary;
  dst_00 = newTemporary(this);
  emit(this,TAC_SUB,dst_00,src1_00,src2_00);
  return;
}

Assistant:

void TACBuilderVisitor::visit(MinusExpression* expression) {
    int src1;
    int src2;
    int dst;

    expression->getLeft()->accept(this);
    src1 = lastTemporary;

    expression->getRight()->accept(this);
    src2 = lastTemporary;

    dst = newTemporary();
    emit(TAC_SUB, dst, src1, src2);
}